

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

parameter_trie_ptr __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::make_subtrie(parameter_trie *this,char c)

{
  _Rb_tree_header *p_Var1;
  undefined1 uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  parameter_trie *p;
  _Rb_tree_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
  _Var5;
  char in_DL;
  shared_count sVar6;
  sp_counted_base *extraout_RDX;
  undefined7 in_register_00000031;
  _Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
  *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_bool>
  pVar7;
  parameter_trie_ptr pVar8;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> local_58;
  pair<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_> local_48;
  
  this_00 = (_Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
             *)CONCAT71(in_register_00000031,c);
  p_Var4 = *(_Base_ptr *)(this_00 + 0x10);
  if (p_Var4 != (_Base_ptr)0x0) {
    _Var5._M_node = (_Base_ptr)(this_00 + 8);
    do {
      uVar2 = (undefined1)p_Var4[1]._M_color;
      sVar6.pi_ = (sp_counted_base *)(ulong)((char)uVar2 < in_DL);
      if (in_DL <= (char)uVar2) {
        _Var5._M_node = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(long)sVar6.pi_];
    } while (p_Var4 != (_Base_ptr)0x0);
    if ((_Var5._M_node != (_Base_ptr)(this_00 + 8)) && ((char)_Var5._M_node[1]._M_color <= in_DL))
    goto LAB_00197c5f;
  }
  p = (parameter_trie *)operator_new(0x60);
  p_Var1 = &(p->m_subtrie)._M_t._M_impl.super__Rb_tree_header;
  (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (p->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (p->m_id_candidates).
  super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (p->m_id_candidates).
  super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (p->m_id_candidates).
  super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (p->m_param_candidate).px = (element_type *)0x0;
  (p->m_param_candidate).pn.pi_ = (sp_counted_base *)0x0;
  p->m_has_final_candidate = false;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>(&local_58,p);
  local_48.second.px = local_58.px;
  local_48.second.pn.pi_ = local_58.pn.pi_;
  local_58.px = (element_type *)0x0;
  local_58.pn.pi_ = (sp_counted_base *)0x0;
  pVar7 = std::
          _Rb_tree<char,std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>,std::_Select1st<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>,std::less<char>,std::allocator<std::pair<char_const,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>>
          ::
          _M_emplace_unique<std::pair<char,boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>>>
                    (this_00,&local_48);
  _Var5 = pVar7.first._M_node;
  detail::shared_count::~shared_count(&local_48.second.pn);
  detail::shared_count::~shared_count(&local_58.pn);
  sVar6.pi_ = extraout_RDX;
LAB_00197c5f:
  *(_Base_ptr *)&(this->m_subtrie)._M_t._M_impl = _Var5._M_node[1]._M_parent;
  p_Var3 = _Var5._M_node[1]._M_left;
  *(_Base_ptr *)&(this->m_subtrie)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var3;
  if (p_Var3 != (_Base_ptr)0x0) {
    LOCK();
    *(int *)&p_Var3->_M_parent = *(int *)&p_Var3->_M_parent + 1;
    UNLOCK();
  }
  pVar8.pn.pi_ = sVar6.pi_;
  pVar8.px = this;
  return pVar8;
}

Assistant:

parameter_trie_ptr  make_subtrie( char c )
    {
        trie_per_char::const_iterator it = m_subtrie.find( c );

        if( it == m_subtrie.end() )
            it = m_subtrie.insert( std::make_pair( c, parameter_trie_ptr( new parameter_trie ) ) ).first;

        return it->second;
    }